

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Flatten_x86_avx512::forward_int8
          (Flatten_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  void *pvVar7;
  void *pvVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  bool bVar26;
  long local_a8;
  long local_a0;
  long local_98;
  
  uVar2 = bottom_blob->dims;
  if (uVar2 == 1) {
    iVar16 = 0;
    if (top_blob != bottom_blob) {
      piVar6 = bottom_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = top_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar6 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar6;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar10 = bottom_blob->w;
      iVar5 = bottom_blob->h;
      iVar24 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar10;
      top_blob->h = iVar5;
      top_blob->d = iVar24;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar10 = bottom_blob->w;
    lVar23 = (long)iVar10;
    uVar3 = bottom_blob->h;
    uVar17 = (ulong)uVar3;
    uVar4 = bottom_blob->c;
    iVar24 = uVar3 * iVar10 * bottom_blob->d;
    iVar5 = bottom_blob->elempack;
    uVar15 = uVar4 * iVar5 * iVar24;
    bVar26 = (uVar15 & 7) == 0;
    sVar13 = bottom_blob->elemsize / (ulong)(long)iVar5 <<
             ((opt->use_packing_layout & bVar26) != 0U) * '\x03';
    if ((opt->use_packing_layout & bVar26) == 0) {
      iVar10 = Flatten::forward((Flatten *)
                                ((long)&this->_vptr_Flatten_x86_avx512 +
                                (long)this->_vptr_Flatten_x86_avx512[-3]),bottom_blob,top_blob,opt);
      return iVar10;
    }
    iVar16 = (int)uVar15 >> 3;
    if (iVar5 == 1 && (uVar2 ^ 2) == 0) {
      if (top_blob != bottom_blob) {
        piVar6 = bottom_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->c = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        piVar6 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar6;
        top_blob->allocator = bottom_blob->allocator;
        iVar10 = bottom_blob->c;
        top_blob->d = bottom_blob->d;
        top_blob->c = iVar10;
      }
      top_blob->dims = 1;
      top_blob->w = iVar16;
      top_blob->h = 1;
      top_blob->cstep = (long)iVar16;
      top_blob->elemsize = sVar13;
      top_blob->elempack = 8;
      iVar16 = 0;
    }
    else {
      Mat::create(top_blob,iVar16,sVar13,8,opt->blob_allocator);
      iVar16 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if ((uVar2 ^ 2) == 0 && iVar5 == 8) {
          iVar11 = 0;
          iVar16 = 0;
          if (0 < iVar10) {
            iVar16 = iVar10;
          }
          if ((int)uVar3 < 1) {
            uVar17 = 0;
          }
          lVar18 = lVar23;
          for (uVar20 = 0; uVar20 != uVar17; uVar20 = uVar20 + 1) {
            lVar21 = bottom_blob->elemsize * uVar20 * (long)bottom_blob->w;
            pvVar7 = bottom_blob->data;
            pvVar8 = top_blob->data;
            for (lVar25 = 0; iVar16 != (int)lVar25; lVar25 = lVar25 + 1) {
              puVar1 = (undefined1 *)((long)pvVar8 + lVar25 + lVar18);
              *(undefined1 *)((long)pvVar8 + lVar25 + iVar11) =
                   *(undefined1 *)((long)pvVar7 + lVar25 * 8 + lVar21);
              *puVar1 = *(undefined1 *)((long)pvVar7 + lVar25 * 8 + lVar21 + 1);
              puVar1[lVar23] = *(undefined1 *)((long)pvVar7 + lVar25 * 8 + lVar21 + 2);
              puVar1[lVar23 * 2] = *(undefined1 *)((long)pvVar7 + lVar25 * 8 + lVar21 + 3);
              puVar1[lVar23 * 3] = *(undefined1 *)((long)pvVar7 + lVar25 * 8 + lVar21 + 4);
              puVar1[lVar23 * 4] = *(undefined1 *)((long)pvVar7 + lVar25 * 8 + lVar21 + 5);
              puVar1[lVar23 * 5] = *(undefined1 *)((long)pvVar7 + lVar25 * 8 + lVar21 + 6);
              puVar1[lVar23 * 6] = *(undefined1 *)((long)pvVar7 + lVar25 * 8 + lVar21 + 7);
            }
            iVar11 = iVar11 + iVar10 * 8;
            lVar18 = lVar18 + lVar23 * 8;
          }
        }
        iVar16 = 0;
        if (uVar2 - 3 < 2) {
          lVar23 = (long)iVar24;
          if (iVar5 == 8) {
            iVar16 = 0;
            iVar10 = 0;
            if (0 < iVar24) {
              iVar10 = iVar24;
            }
            uVar17 = 0;
            if (0 < (int)uVar4) {
              uVar17 = (ulong)uVar4;
            }
            lVar18 = lVar23 * 8;
            lVar12 = lVar23 * 2;
            lVar25 = lVar23 * 3;
            lVar21 = lVar23 * 4;
            local_a0 = lVar23 * 5;
            local_a8 = lVar23 * 6;
            local_98 = lVar23 * 7;
            lVar22 = lVar23;
            for (uVar20 = 0; uVar20 != uVar17; uVar20 = uVar20 + 1) {
              pvVar7 = top_blob->data;
              lVar14 = bottom_blob->cstep * bottom_blob->elemsize * uVar20;
              pvVar8 = bottom_blob->data;
              for (lVar19 = 0; iVar10 != (int)lVar19; lVar19 = lVar19 + 1) {
                *(undefined1 *)((long)pvVar7 + lVar19 + iVar16) =
                     *(undefined1 *)((long)pvVar8 + lVar19 * 8 + lVar14);
                *(undefined1 *)((long)pvVar7 + lVar19 + lVar22) =
                     *(undefined1 *)((long)pvVar8 + lVar19 * 8 + lVar14 + 1);
                *(undefined1 *)((long)pvVar7 + lVar19 + lVar12) =
                     *(undefined1 *)((long)pvVar8 + lVar19 * 8 + lVar14 + 2);
                *(undefined1 *)((long)pvVar7 + lVar19 + lVar25) =
                     *(undefined1 *)((long)pvVar8 + lVar19 * 8 + lVar14 + 3);
                *(undefined1 *)((long)pvVar7 + lVar19 + lVar21) =
                     *(undefined1 *)((long)pvVar8 + lVar19 * 8 + lVar14 + 4);
                *(undefined1 *)((long)pvVar7 + lVar19 + local_a0) =
                     *(undefined1 *)((long)pvVar8 + lVar19 * 8 + lVar14 + 5);
                *(undefined1 *)((long)pvVar7 + lVar19 + local_a8) =
                     *(undefined1 *)((long)pvVar8 + lVar19 * 8 + lVar14 + 6);
                *(undefined1 *)((long)pvVar7 + lVar19 + local_98) =
                     *(undefined1 *)((long)pvVar8 + lVar19 * 8 + lVar14 + 7);
              }
              iVar16 = iVar16 + iVar24 * 8;
              lVar22 = lVar22 + lVar18;
              lVar12 = lVar12 + lVar18;
              lVar25 = lVar25 + lVar18;
              lVar21 = lVar21 + lVar18;
              local_a0 = local_a0 + lVar18;
              local_a8 = local_a8 + lVar18;
              local_98 = local_98 + lVar18;
            }
          }
          iVar16 = 0;
          if (iVar5 == 1) {
            iVar16 = 0;
            if (iVar24 < 1) {
              iVar24 = iVar16;
            }
            uVar17 = (ulong)uVar4;
            if ((int)uVar4 < 1) {
              uVar17 = 0;
            }
            lVar18 = 0;
            for (uVar20 = 0; uVar20 != uVar17; uVar20 = uVar20 + 1) {
              sVar13 = bottom_blob->cstep;
              sVar9 = bottom_blob->elemsize;
              pvVar7 = bottom_blob->data;
              pvVar8 = top_blob->data;
              for (lVar21 = 0; iVar24 != (int)lVar21; lVar21 = lVar21 + 1) {
                *(undefined1 *)((long)pvVar8 + lVar21 + lVar18) =
                     *(undefined1 *)((long)pvVar7 + lVar21 + sVar13 * sVar9 * uVar20);
              }
              lVar18 = lVar18 + lVar23;
            }
          }
        }
      }
    }
  }
  return iVar16;
}

Assistant:

int Flatten_x86_avx512::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
        out_elempack = total % 8 == 0 ? 8 : 1;
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 8
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const signed char* ptr = bottom_blob.row<const signed char>(i);
                signed char* outptr0 = (signed char*)top_blob + w * i * 8;
                signed char* outptr1 = (signed char*)top_blob + w * (i * 8 + 1);
                signed char* outptr2 = (signed char*)top_blob + w * (i * 8 + 2);
                signed char* outptr3 = (signed char*)top_blob + w * (i * 8 + 3);
                signed char* outptr4 = (signed char*)top_blob + w * (i * 8 + 4);
                signed char* outptr5 = (signed char*)top_blob + w * (i * 8 + 5);
                signed char* outptr6 = (signed char*)top_blob + w * (i * 8 + 6);
                signed char* outptr7 = (signed char*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* ptr = bottom_blob.channel(q);
                signed char* outptr0 = (signed char*)top_blob + size * q * 8;
                signed char* outptr1 = (signed char*)top_blob + size * (q * 8 + 1);
                signed char* outptr2 = (signed char*)top_blob + size * (q * 8 + 2);
                signed char* outptr3 = (signed char*)top_blob + size * (q * 8 + 3);
                signed char* outptr4 = (signed char*)top_blob + size * (q * 8 + 4);
                signed char* outptr5 = (signed char*)top_blob + size * (q * 8 + 5);
                signed char* outptr6 = (signed char*)top_blob + size * (q * 8 + 6);
                signed char* outptr7 = (signed char*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }

        if (elempack == 1) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* ptr = bottom_blob.channel(q);
                signed char* outptr = (signed char*)top_blob + size * q;

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}